

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O0

bool write_file(xr_file_system *fs,string *path,void *data,size_t size)

{
  bool bVar1;
  xr_writer *local_38;
  xr_writer *w;
  size_t size_local;
  void *data_local;
  string *path_local;
  xr_file_system *fs_local;
  
  w = (xr_writer *)size;
  size_local = (size_t)data;
  data_local = path;
  path_local = (string *)fs;
  local_38 = xray_re::xr_file_system::w_open(fs,path);
  bVar1 = local_38 != (xr_writer *)0x0;
  if (bVar1) {
    (*local_38->_vptr_xr_writer[2])(local_38,size_local,w);
    xray_re::xr_file_system::w_close((xr_file_system *)path_local,&local_38);
  }
  return bVar1;
}

Assistant:

static bool write_file(xr_file_system& fs, const std::string& path, const void* data, size_t size)
{
	xr_writer* w = fs.w_open(path);
	if (w) {
		w->w_raw(data, size);
		fs.w_close(w);
		return true;
	}
	return false;
}